

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O2

void __thiscall btBoxShape::getVertex(btBoxShape *this,int i,btVector3 *vtx)

{
  uint uVar1;
  uint uVar2;
  btVector3 bVar3;
  
  bVar3 = getHalfExtentsWithMargin(this);
  uVar1 = (uint)i >> 2 & 1;
  uVar2 = (uint)i >> 1 & 1;
  *(ulong *)vtx->m_floats =
       CONCAT44((float)(uVar2 ^ 1) * bVar3.m_floats[1] - (float)uVar2 * bVar3.m_floats[1],
                (float)(i & 1U ^ 1) * bVar3.m_floats[0] - (float)(i & 1U) * bVar3.m_floats[0]);
  vtx->m_floats[2] = (float)(uVar1 ^ 1) * bVar3.m_floats[2] - (float)uVar1 * bVar3.m_floats[2];
  vtx->m_floats[3] = 0.0;
  return;
}

Assistant:

virtual void getVertex(int i,btVector3& vtx) const
	{
		btVector3 halfExtents = getHalfExtentsWithMargin();

		vtx = btVector3(
				halfExtents.x() * (1-(i&1)) - halfExtents.x() * (i&1),
				halfExtents.y() * (1-((i&2)>>1)) - halfExtents.y() * ((i&2)>>1),
				halfExtents.z() * (1-((i&4)>>2)) - halfExtents.z() * ((i&4)>>2));
	}